

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O2

CallFrame * __thiscall pstack::Dwarf::FDE::defaultFrame(CallFrame *__return_storage_ptr__,FDE *this)

{
  Off OVar1;
  byte bVar2;
  Off OVar3;
  CallFrame *pCVar4;
  undefined1 local_128 [8];
  CallFrame dframe;
  stack<pstack::Dwarf::CallFrame,_std::deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>_>
  stack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  CIE *local_70;
  DWARFReader local_60;
  uint local_34;
  int reg;
  
  CallFrame::CallFrame((CallFrame *)local_128);
  local_70 = this->cie;
  OVar1 = local_70->initial_instructions;
  OVar3 = local_70->end;
  std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)
             &stack.c.
              super__Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)local_70->frameInfo);
  local_60.off = OVar1;
  if (OVar3 == 0xffffffffffffffff) {
    OVar3 = (*(code *)((*stack.c.
                         super__Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node)->cfaValue).u.same)();
  }
  local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       stack.c.
       super__Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_80._M_pi;
  stack.c.super__Deque_base<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.addrLen = 8;
  local_60.end = OVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffff80);
  std::
  stack<pstack::Dwarf::CallFrame,std::deque<pstack::Dwarf::CallFrame,std::allocator<pstack::Dwarf::CallFrame>>>
  ::stack<std::deque<pstack::Dwarf::CallFrame,std::allocator<pstack::Dwarf::CallFrame>>,void>
            ((stack<pstack::Dwarf::CallFrame,_std::deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>_>
              *)((long)&dframe.cfaValue.u + 8));
  CallFrame::CallFrame(__return_storage_ptr__,(CallFrame *)local_128);
  if (local_60.off != local_60.end) {
    bVar2 = DWARFReader::getu8(&local_60);
    local_34 = bVar2 & 0x3f;
    pCVar4 = (CallFrame *)
             (*(code *)(&DAT_0017e564 + *(int *)(&DAT_0017e564 + (ulong)(bVar2 >> 6) * 4)))();
    return pCVar4;
  }
  std::deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_>::~deque
            ((deque<pstack::Dwarf::CallFrame,_std::allocator<pstack::Dwarf::CallFrame>_> *)
             ((long)&dframe.cfaValue.u + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pstack::Dwarf::RegisterUnwind>,_std::_Select1st<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Dwarf::RegisterUnwind>_>_>
               *)local_128);
  return __return_storage_ptr__;
}

Assistant:

CallFrame
FDE::defaultFrame() const {
   CallFrame dframe;
   // Execute all of the initial_instructions in the CIE, creating the starting
   // point for a frame. XXX: It might be worth caching this in the CIE, but
   // there's rarely a huge number of instructions here .
   // The initial instructions extend from the given point in the CIE to the
   // end of its extent.
   return cie.execInsns(dframe, cie.initial_instructions, cie.end, 0,
         [](uintmax_t, CallFrame &) { return false; });
}